

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressorSimd.h
# Opt level: O0

void Imf_3_2::anon_unknown_2::dctInverse8x8_sse2<2>(float *data)

{
  undefined8 uVar1;
  float *pfVar2;
  float *in_RDI;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  __m128 beta [4];
  __m128 alpha [4];
  __m128 in [8];
  __m128 oddSum;
  __m128 evenSum;
  __m128 x [8];
  __m128 *srcVec;
  __m128 c7;
  __m128 c6;
  __m128 c5;
  __m128 c4;
  __m128 c3;
  __m128 c2;
  __m128 c1;
  __m128 c0;
  __m128 g;
  __m128 f;
  __m128 e;
  __m128 d;
  __m128 c;
  __m128 b;
  __m128 a;
  int local_17c0;
  int local_17bc;
  undefined8 local_16b8 [98];
  float local_13a8;
  float fStack_13a4;
  float fStack_13a0;
  float fStack_139c;
  float local_1398;
  float fStack_1394;
  float fStack_1390;
  float fStack_138c;
  float local_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float local_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float local_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float local_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float local_988;
  float fStack_984;
  float fStack_980;
  float fStack_97c;
  float local_948;
  float fStack_944;
  float fStack_940;
  float fStack_93c;
  int i;
  int col;
  __m128 gamma [4];
  
  fVar36 = *in_RDI;
  fVar42 = in_RDI[1];
  fVar38 = in_RDI[2];
  fVar3 = in_RDI[3];
  fVar40 = in_RDI[4];
  fVar4 = in_RDI[5];
  fVar41 = in_RDI[6];
  fVar5 = in_RDI[7];
  fVar35 = fVar36 * 0.3535536 + 0.0 + fVar38 * 0.4619398 + fVar40 * 0.3535536 + fVar41 * 0.1913422;
  fVar37 = fVar36 * 0.3535536 + 0.0 + fVar38 * 0.1913422 + fVar40 * -0.3535536 + fVar41 * -0.4619398
  ;
  fVar39 = fVar36 * 0.3535536 + 0.0 + fVar38 * -0.1913422 + fVar40 * -0.3535536 + fVar41 * 0.4619398
  ;
  fVar41 = fVar36 * 0.3535536 + 0.0 + fVar38 * -0.4619398 + fVar40 * 0.3535536 + fVar41 * -0.1913422
  ;
  fVar36 = fVar42 * 0.4903927 + 0.0 + fVar3 * 0.4157349 + fVar4 * 0.2777855 + fVar5 * 0.09754573;
  fVar38 = fVar42 * 0.4157349 + 0.0 + fVar3 * -0.09754573 + fVar4 * -0.4903927 + fVar5 * -0.2777855;
  fVar40 = fVar42 * 0.2777855 + 0.0 + fVar3 * -0.4903927 + fVar4 * 0.09754573 + fVar5 * 0.4157349;
  fVar42 = fVar42 * 0.09754573 + 0.0 + fVar3 * -0.2777855 + fVar4 * 0.4157349 + fVar5 * -0.4903927;
  *in_RDI = fVar35 + fVar36;
  in_RDI[1] = fVar37 + fVar38;
  in_RDI[2] = fVar39 + fVar40;
  in_RDI[3] = fVar41 + fVar42;
  in_RDI[4] = fVar35 - fVar36;
  in_RDI[5] = fVar37 - fVar38;
  in_RDI[6] = fVar39 - fVar40;
  in_RDI[7] = fVar41 - fVar42;
  fVar36 = in_RDI[4];
  fVar42 = in_RDI[5];
  in_RDI[4] = in_RDI[7];
  in_RDI[5] = in_RDI[6];
  in_RDI[6] = fVar42;
  in_RDI[7] = fVar36;
  fVar36 = in_RDI[8];
  fVar42 = in_RDI[9];
  fVar38 = in_RDI[10];
  fVar3 = in_RDI[0xb];
  fVar40 = in_RDI[0xc];
  fVar4 = in_RDI[0xd];
  fVar41 = in_RDI[0xe];
  fVar5 = in_RDI[0xf];
  fVar35 = fVar36 * 0.3535536 + 0.0 + fVar38 * 0.4619398 + fVar40 * 0.3535536 + fVar41 * 0.1913422;
  fVar37 = fVar36 * 0.3535536 + 0.0 + fVar38 * 0.1913422 + fVar40 * -0.3535536 + fVar41 * -0.4619398
  ;
  fVar39 = fVar36 * 0.3535536 + 0.0 + fVar38 * -0.1913422 + fVar40 * -0.3535536 + fVar41 * 0.4619398
  ;
  fVar41 = fVar36 * 0.3535536 + 0.0 + fVar38 * -0.4619398 + fVar40 * 0.3535536 + fVar41 * -0.1913422
  ;
  fVar36 = fVar42 * 0.4903927 + 0.0 + fVar3 * 0.4157349 + fVar4 * 0.2777855 + fVar5 * 0.09754573;
  fVar38 = fVar42 * 0.4157349 + 0.0 + fVar3 * -0.09754573 + fVar4 * -0.4903927 + fVar5 * -0.2777855;
  fVar40 = fVar42 * 0.2777855 + 0.0 + fVar3 * -0.4903927 + fVar4 * 0.09754573 + fVar5 * 0.4157349;
  fVar42 = fVar42 * 0.09754573 + 0.0 + fVar3 * -0.2777855 + fVar4 * 0.4157349 + fVar5 * -0.4903927;
  in_RDI[8] = fVar35 + fVar36;
  in_RDI[9] = fVar37 + fVar38;
  in_RDI[10] = fVar39 + fVar40;
  in_RDI[0xb] = fVar41 + fVar42;
  in_RDI[0xc] = fVar35 - fVar36;
  in_RDI[0xd] = fVar37 - fVar38;
  in_RDI[0xe] = fVar39 - fVar40;
  in_RDI[0xf] = fVar41 - fVar42;
  fVar36 = in_RDI[0xc];
  fVar42 = in_RDI[0xd];
  in_RDI[0xc] = in_RDI[0xf];
  in_RDI[0xd] = in_RDI[0xe];
  in_RDI[0xe] = fVar42;
  in_RDI[0xf] = fVar36;
  fVar36 = in_RDI[0x10];
  fVar42 = in_RDI[0x11];
  fVar38 = in_RDI[0x12];
  fVar3 = in_RDI[0x13];
  fVar40 = in_RDI[0x14];
  fVar4 = in_RDI[0x15];
  fVar41 = in_RDI[0x16];
  fVar5 = in_RDI[0x17];
  fVar35 = fVar36 * 0.3535536 + 0.0 + fVar38 * 0.4619398 + fVar40 * 0.3535536 + fVar41 * 0.1913422;
  fVar37 = fVar36 * 0.3535536 + 0.0 + fVar38 * 0.1913422 + fVar40 * -0.3535536 + fVar41 * -0.4619398
  ;
  fVar39 = fVar36 * 0.3535536 + 0.0 + fVar38 * -0.1913422 + fVar40 * -0.3535536 + fVar41 * 0.4619398
  ;
  fVar41 = fVar36 * 0.3535536 + 0.0 + fVar38 * -0.4619398 + fVar40 * 0.3535536 + fVar41 * -0.1913422
  ;
  fVar36 = fVar42 * 0.4903927 + 0.0 + fVar3 * 0.4157349 + fVar4 * 0.2777855 + fVar5 * 0.09754573;
  fVar38 = fVar42 * 0.4157349 + 0.0 + fVar3 * -0.09754573 + fVar4 * -0.4903927 + fVar5 * -0.2777855;
  fVar40 = fVar42 * 0.2777855 + 0.0 + fVar3 * -0.4903927 + fVar4 * 0.09754573 + fVar5 * 0.4157349;
  fVar42 = fVar42 * 0.09754573 + 0.0 + fVar3 * -0.2777855 + fVar4 * 0.4157349 + fVar5 * -0.4903927;
  in_RDI[0x10] = fVar35 + fVar36;
  in_RDI[0x11] = fVar37 + fVar38;
  in_RDI[0x12] = fVar39 + fVar40;
  in_RDI[0x13] = fVar41 + fVar42;
  in_RDI[0x14] = fVar35 - fVar36;
  in_RDI[0x15] = fVar37 - fVar38;
  in_RDI[0x16] = fVar39 - fVar40;
  in_RDI[0x17] = fVar41 - fVar42;
  fVar36 = in_RDI[0x14];
  fVar42 = in_RDI[0x15];
  in_RDI[0x14] = in_RDI[0x17];
  in_RDI[0x15] = in_RDI[0x16];
  in_RDI[0x16] = fVar42;
  in_RDI[0x17] = fVar36;
  fVar36 = in_RDI[0x18];
  fVar42 = in_RDI[0x19];
  fVar38 = in_RDI[0x1a];
  fVar3 = in_RDI[0x1b];
  fVar40 = in_RDI[0x1c];
  fVar4 = in_RDI[0x1d];
  fVar41 = in_RDI[0x1e];
  fVar5 = in_RDI[0x1f];
  fVar35 = fVar36 * 0.3535536 + 0.0 + fVar38 * 0.4619398 + fVar40 * 0.3535536 + fVar41 * 0.1913422;
  fVar37 = fVar36 * 0.3535536 + 0.0 + fVar38 * 0.1913422 + fVar40 * -0.3535536 + fVar41 * -0.4619398
  ;
  fVar39 = fVar36 * 0.3535536 + 0.0 + fVar38 * -0.1913422 + fVar40 * -0.3535536 + fVar41 * 0.4619398
  ;
  fVar41 = fVar36 * 0.3535536 + 0.0 + fVar38 * -0.4619398 + fVar40 * 0.3535536 + fVar41 * -0.1913422
  ;
  fVar36 = fVar42 * 0.4903927 + 0.0 + fVar3 * 0.4157349 + fVar4 * 0.2777855 + fVar5 * 0.09754573;
  fVar38 = fVar42 * 0.4157349 + 0.0 + fVar3 * -0.09754573 + fVar4 * -0.4903927 + fVar5 * -0.2777855;
  fVar40 = fVar42 * 0.2777855 + 0.0 + fVar3 * -0.4903927 + fVar4 * 0.09754573 + fVar5 * 0.4157349;
  fVar42 = fVar42 * 0.09754573 + 0.0 + fVar3 * -0.2777855 + fVar4 * 0.4157349 + fVar5 * -0.4903927;
  in_RDI[0x18] = fVar35 + fVar36;
  in_RDI[0x19] = fVar37 + fVar38;
  in_RDI[0x1a] = fVar39 + fVar40;
  in_RDI[0x1b] = fVar41 + fVar42;
  in_RDI[0x1c] = fVar35 - fVar36;
  in_RDI[0x1d] = fVar37 - fVar38;
  in_RDI[0x1e] = fVar39 - fVar40;
  in_RDI[0x1f] = fVar41 - fVar42;
  fVar36 = in_RDI[0x1c];
  fVar42 = in_RDI[0x1d];
  in_RDI[0x1c] = in_RDI[0x1f];
  in_RDI[0x1d] = in_RDI[0x1e];
  in_RDI[0x1e] = fVar42;
  in_RDI[0x1f] = fVar36;
  fVar36 = in_RDI[0x20];
  fVar42 = in_RDI[0x21];
  fVar38 = in_RDI[0x22];
  fVar3 = in_RDI[0x23];
  fVar40 = in_RDI[0x24];
  fVar4 = in_RDI[0x25];
  fVar41 = in_RDI[0x26];
  fVar5 = in_RDI[0x27];
  fVar35 = fVar36 * 0.3535536 + 0.0 + fVar38 * 0.4619398 + fVar40 * 0.3535536 + fVar41 * 0.1913422;
  fVar37 = fVar36 * 0.3535536 + 0.0 + fVar38 * 0.1913422 + fVar40 * -0.3535536 + fVar41 * -0.4619398
  ;
  fVar39 = fVar36 * 0.3535536 + 0.0 + fVar38 * -0.1913422 + fVar40 * -0.3535536 + fVar41 * 0.4619398
  ;
  fVar41 = fVar36 * 0.3535536 + 0.0 + fVar38 * -0.4619398 + fVar40 * 0.3535536 + fVar41 * -0.1913422
  ;
  fVar36 = fVar42 * 0.4903927 + 0.0 + fVar3 * 0.4157349 + fVar4 * 0.2777855 + fVar5 * 0.09754573;
  fVar38 = fVar42 * 0.4157349 + 0.0 + fVar3 * -0.09754573 + fVar4 * -0.4903927 + fVar5 * -0.2777855;
  fVar40 = fVar42 * 0.2777855 + 0.0 + fVar3 * -0.4903927 + fVar4 * 0.09754573 + fVar5 * 0.4157349;
  fVar42 = fVar42 * 0.09754573 + 0.0 + fVar3 * -0.2777855 + fVar4 * 0.4157349 + fVar5 * -0.4903927;
  in_RDI[0x20] = fVar35 + fVar36;
  in_RDI[0x21] = fVar37 + fVar38;
  in_RDI[0x22] = fVar39 + fVar40;
  in_RDI[0x23] = fVar41 + fVar42;
  in_RDI[0x24] = fVar35 - fVar36;
  in_RDI[0x25] = fVar37 - fVar38;
  in_RDI[0x26] = fVar39 - fVar40;
  in_RDI[0x27] = fVar41 - fVar42;
  fVar36 = in_RDI[0x24];
  fVar42 = in_RDI[0x25];
  in_RDI[0x24] = in_RDI[0x27];
  in_RDI[0x25] = in_RDI[0x26];
  in_RDI[0x26] = fVar42;
  in_RDI[0x27] = fVar36;
  fVar36 = in_RDI[0x28];
  fVar42 = in_RDI[0x29];
  fVar38 = in_RDI[0x2a];
  fVar3 = in_RDI[0x2b];
  fVar40 = in_RDI[0x2c];
  fVar4 = in_RDI[0x2d];
  fVar41 = in_RDI[0x2e];
  fVar5 = in_RDI[0x2f];
  fVar35 = fVar36 * 0.3535536 + 0.0 + fVar38 * 0.4619398 + fVar40 * 0.3535536 + fVar41 * 0.1913422;
  fVar37 = fVar36 * 0.3535536 + 0.0 + fVar38 * 0.1913422 + fVar40 * -0.3535536 + fVar41 * -0.4619398
  ;
  fVar39 = fVar36 * 0.3535536 + 0.0 + fVar38 * -0.1913422 + fVar40 * -0.3535536 + fVar41 * 0.4619398
  ;
  fVar41 = fVar36 * 0.3535536 + 0.0 + fVar38 * -0.4619398 + fVar40 * 0.3535536 + fVar41 * -0.1913422
  ;
  fVar36 = fVar42 * 0.4903927 + 0.0 + fVar3 * 0.4157349 + fVar4 * 0.2777855 + fVar5 * 0.09754573;
  fVar38 = fVar42 * 0.4157349 + 0.0 + fVar3 * -0.09754573 + fVar4 * -0.4903927 + fVar5 * -0.2777855;
  fVar40 = fVar42 * 0.2777855 + 0.0 + fVar3 * -0.4903927 + fVar4 * 0.09754573 + fVar5 * 0.4157349;
  fVar42 = fVar42 * 0.09754573 + 0.0 + fVar3 * -0.2777855 + fVar4 * 0.4157349 + fVar5 * -0.4903927;
  in_RDI[0x28] = fVar35 + fVar36;
  in_RDI[0x29] = fVar37 + fVar38;
  in_RDI[0x2a] = fVar39 + fVar40;
  in_RDI[0x2b] = fVar41 + fVar42;
  in_RDI[0x2c] = fVar35 - fVar36;
  in_RDI[0x2d] = fVar37 - fVar38;
  in_RDI[0x2e] = fVar39 - fVar40;
  in_RDI[0x2f] = fVar41 - fVar42;
  fVar36 = in_RDI[0x2c];
  fVar42 = in_RDI[0x2d];
  in_RDI[0x2c] = in_RDI[0x2f];
  in_RDI[0x2d] = in_RDI[0x2e];
  in_RDI[0x2e] = fVar42;
  in_RDI[0x2f] = fVar36;
  for (local_17bc = 0; local_17bc < 2; local_17bc = local_17bc + 1) {
    for (local_17c0 = 0; local_17c0 < 8; local_17c0 = local_17c0 + 1) {
      uVar1 = *(undefined8 *)(in_RDI + (long)(local_17c0 * 2 + local_17bc) * 4 + 2);
      local_16b8[(long)local_17c0 * 2] =
           *(undefined8 *)(in_RDI + (long)(local_17c0 * 2 + local_17bc) * 4);
      local_16b8[(long)local_17c0 * 2 + 1] = uVar1;
    }
    local_948 = (float)local_16b8[4];
    fStack_944 = (float)((ulong)local_16b8[4] >> 0x20);
    fStack_940 = (float)local_16b8[5];
    fStack_93c = (float)((ulong)local_16b8[5] >> 0x20);
    local_988 = (float)local_16b8[0xc];
    fStack_984 = (float)((ulong)local_16b8[0xc] >> 0x20);
    fStack_980 = (float)local_16b8[0xd];
    fStack_97c = (float)((ulong)local_16b8[0xd] >> 0x20);
    local_9b8 = (float)local_16b8[2];
    fStack_9b4 = (float)((ulong)local_16b8[2] >> 0x20);
    fStack_9b0 = (float)local_16b8[3];
    fStack_9ac = (float)((ulong)local_16b8[3] >> 0x20);
    local_9d8 = (float)local_16b8[6];
    fStack_9d4 = (float)((ulong)local_16b8[6] >> 0x20);
    fStack_9d0 = (float)local_16b8[7];
    fStack_9cc = (float)((ulong)local_16b8[7] >> 0x20);
    local_9f8 = (float)local_16b8[10];
    fStack_9f4 = (float)((ulong)local_16b8[10] >> 0x20);
    fStack_9f0 = (float)local_16b8[0xb];
    fStack_9ec = (float)((ulong)local_16b8[0xb] >> 0x20);
    local_a18 = (float)local_16b8[0xe];
    fStack_a14 = (float)((ulong)local_16b8[0xe] >> 0x20);
    fStack_a10 = (float)local_16b8[0xf];
    fStack_a0c = (float)((ulong)local_16b8[0xf] >> 0x20);
    fVar36 = local_9b8 * 0.4903927 + local_9d8 * 0.4157349 +
             local_9f8 * 0.2777855 + local_a18 * 0.09754573;
    fVar39 = fStack_9b4 * 0.4903927 + fStack_9d4 * 0.4157349 +
             fStack_9f4 * 0.2777855 + fStack_a14 * 0.09754573;
    fVar15 = fStack_9b0 * 0.4903927 + fStack_9d0 * 0.4157349 +
             fStack_9f0 * 0.2777855 + fStack_a10 * 0.09754573;
    fVar25 = fStack_9ac * 0.4903927 + fStack_9cc * 0.4157349 +
             fStack_9ec * 0.2777855 + fStack_a0c * 0.09754573;
    fVar42 = (local_9b8 * 0.4157349 - local_9d8 * 0.09754573) -
             (local_9f8 * 0.4903927 + local_a18 * 0.2777855);
    fVar6 = (fStack_9b4 * 0.4157349 - fStack_9d4 * 0.09754573) -
            (fStack_9f4 * 0.4903927 + fStack_a14 * 0.2777855);
    fVar16 = (fStack_9b0 * 0.4157349 - fStack_9d0 * 0.09754573) -
             (fStack_9f0 * 0.4903927 + fStack_a10 * 0.2777855);
    fVar26 = (fStack_9ac * 0.4157349 - fStack_9cc * 0.09754573) -
             (fStack_9ec * 0.4903927 + fStack_a0c * 0.2777855);
    fVar38 = (local_9b8 * 0.2777855 - local_9d8 * 0.4903927) +
             local_9f8 * 0.09754573 + local_a18 * 0.4157349;
    fVar7 = (fStack_9b4 * 0.2777855 - fStack_9d4 * 0.4903927) +
            fStack_9f4 * 0.09754573 + fStack_a14 * 0.4157349;
    fVar17 = (fStack_9b0 * 0.2777855 - fStack_9d0 * 0.4903927) +
             fStack_9f0 * 0.09754573 + fStack_a10 * 0.4157349;
    fVar27 = (fStack_9ac * 0.2777855 - fStack_9cc * 0.4903927) +
             fStack_9ec * 0.09754573 + fStack_a0c * 0.4157349;
    fVar3 = (local_9b8 * 0.09754573 - local_9d8 * 0.2777855) +
            (local_9f8 * 0.4157349 - local_a18 * 0.4903927);
    fVar8 = (fStack_9b4 * 0.09754573 - fStack_9d4 * 0.2777855) +
            (fStack_9f4 * 0.4157349 - fStack_a14 * 0.4903927);
    fVar18 = (fStack_9b0 * 0.09754573 - fStack_9d0 * 0.2777855) +
             (fStack_9f0 * 0.4157349 - fStack_a10 * 0.4903927);
    fVar28 = (fStack_9ac * 0.09754573 - fStack_9cc * 0.2777855) +
             (fStack_9ec * 0.4157349 - fStack_a0c * 0.4903927);
    local_1398 = (float)local_16b8[0];
    fStack_1394 = (float)((ulong)local_16b8[0] >> 0x20);
    fStack_1390 = (float)local_16b8[1];
    fStack_138c = (float)((ulong)local_16b8[1] >> 0x20);
    local_13a8 = (float)local_16b8[8];
    fStack_13a4 = (float)((ulong)local_16b8[8] >> 0x20);
    fStack_13a0 = (float)local_16b8[9];
    fStack_139c = (float)((ulong)local_16b8[9] >> 0x20);
    fVar37 = (local_1398 + local_13a8) * 0.3535536;
    fVar9 = (fStack_1394 + fStack_13a4) * 0.3535536;
    fVar19 = (fStack_1390 + fStack_13a0) * 0.3535536;
    fVar29 = (fStack_138c + fStack_139c) * 0.3535536;
    fVar35 = (local_1398 - local_13a8) * 0.3535536;
    fVar10 = (fStack_1394 - fStack_13a4) * 0.3535536;
    fVar20 = (fStack_1390 - fStack_13a0) * 0.3535536;
    fVar30 = (fStack_138c - fStack_139c) * 0.3535536;
    fVar40 = local_948 * 0.4619398 + local_988 * 0.1913422;
    fVar11 = fStack_944 * 0.4619398 + fStack_984 * 0.1913422;
    fVar21 = fStack_940 * 0.4619398 + fStack_980 * 0.1913422;
    fVar31 = fStack_93c * 0.4619398 + fStack_97c * 0.1913422;
    fVar4 = local_948 * 0.1913422 - local_988 * 0.4619398;
    fVar12 = fStack_944 * 0.1913422 - fStack_984 * 0.4619398;
    fVar22 = fStack_940 * 0.1913422 - fStack_980 * 0.4619398;
    fVar32 = fStack_93c * 0.1913422 - fStack_97c * 0.4619398;
    fVar41 = fVar37 + fVar40;
    fVar13 = fVar9 + fVar11;
    fVar23 = fVar19 + fVar21;
    fVar33 = fVar29 + fVar31;
    fVar5 = fVar35 + fVar4;
    fVar14 = fVar10 + fVar12;
    fVar24 = fVar20 + fVar22;
    fVar34 = fVar30 + fVar32;
    fVar35 = fVar35 - fVar4;
    fVar10 = fVar10 - fVar12;
    fVar20 = fVar20 - fVar22;
    fVar30 = fVar30 - fVar32;
    fVar37 = fVar37 - fVar40;
    fVar9 = fVar9 - fVar11;
    fVar19 = fVar19 - fVar21;
    fVar29 = fVar29 - fVar31;
    pfVar2 = in_RDI + (long)local_17bc * 4;
    *pfVar2 = fVar41 + fVar36;
    pfVar2[1] = fVar13 + fVar39;
    pfVar2[2] = fVar23 + fVar15;
    pfVar2[3] = fVar33 + fVar25;
    pfVar2 = in_RDI + (long)(local_17bc + 2) * 4;
    *pfVar2 = fVar5 + fVar42;
    pfVar2[1] = fVar14 + fVar6;
    pfVar2[2] = fVar24 + fVar16;
    pfVar2[3] = fVar34 + fVar26;
    pfVar2 = in_RDI + (long)(local_17bc + 4) * 4;
    *pfVar2 = fVar35 + fVar38;
    pfVar2[1] = fVar10 + fVar7;
    pfVar2[2] = fVar20 + fVar17;
    pfVar2[3] = fVar30 + fVar27;
    pfVar2 = in_RDI + (long)(local_17bc + 6) * 4;
    *pfVar2 = fVar37 + fVar3;
    pfVar2[1] = fVar9 + fVar8;
    pfVar2[2] = fVar19 + fVar18;
    pfVar2[3] = fVar29 + fVar28;
    pfVar2 = in_RDI + (long)(local_17bc + 8) * 4;
    *pfVar2 = fVar37 - fVar3;
    pfVar2[1] = fVar9 - fVar8;
    pfVar2[2] = fVar19 - fVar18;
    pfVar2[3] = fVar29 - fVar28;
    pfVar2 = in_RDI + (long)(local_17bc + 10) * 4;
    *pfVar2 = fVar35 - fVar38;
    pfVar2[1] = fVar10 - fVar7;
    pfVar2[2] = fVar20 - fVar17;
    pfVar2[3] = fVar30 - fVar27;
    pfVar2 = in_RDI + (long)(local_17bc + 0xc) * 4;
    *pfVar2 = fVar5 - fVar42;
    pfVar2[1] = fVar14 - fVar6;
    pfVar2[2] = fVar24 - fVar16;
    pfVar2[3] = fVar34 - fVar26;
    pfVar2 = in_RDI + (long)(local_17bc + 0xe) * 4;
    *pfVar2 = fVar41 - fVar36;
    pfVar2[1] = fVar13 - fVar39;
    pfVar2[2] = fVar23 - fVar15;
    pfVar2[3] = fVar33 - fVar25;
  }
  return;
}

Assistant:

void
dctInverse8x8_sse2 (float* data)
{
#ifdef IMF_HAVE_SSE2
    __m128 a = {3.535536e-01f, 3.535536e-01f, 3.535536e-01f, 3.535536e-01f};
    __m128 b = {4.903927e-01f, 4.903927e-01f, 4.903927e-01f, 4.903927e-01f};
    __m128 c = {4.619398e-01f, 4.619398e-01f, 4.619398e-01f, 4.619398e-01f};
    __m128 d = {4.157349e-01f, 4.157349e-01f, 4.157349e-01f, 4.157349e-01f};
    __m128 e = {2.777855e-01f, 2.777855e-01f, 2.777855e-01f, 2.777855e-01f};
    __m128 f = {1.913422e-01f, 1.913422e-01f, 1.913422e-01f, 1.913422e-01f};
    __m128 g = {9.754573e-02f, 9.754573e-02f, 9.754573e-02f, 9.754573e-02f};

    __m128 c0 = {3.535536e-01f, 3.535536e-01f, 3.535536e-01f, 3.535536e-01f};
    __m128 c1 = {4.619398e-01f, 1.913422e-01f, -1.913422e-01f, -4.619398e-01f};
    __m128 c2 = {3.535536e-01f, -3.535536e-01f, -3.535536e-01f, 3.535536e-01f};
    __m128 c3 = {1.913422e-01f, -4.619398e-01f, 4.619398e-01f, -1.913422e-01f};

    __m128 c4 = {4.903927e-01f, 4.157349e-01f, 2.777855e-01f, 9.754573e-02f};
    __m128 c5 = {4.157349e-01f, -9.754573e-02f, -4.903927e-01f, -2.777855e-01f};
    __m128 c6 = {2.777855e-01f, -4.903927e-01f, 9.754573e-02f, 4.157349e-01f};
    __m128 c7 = {9.754573e-02f, -2.777855e-01f, 4.157349e-01f, -4.903927e-01f};

    __m128* srcVec = (__m128*) data;
    __m128  x[8], evenSum, oddSum;
    __m128  in[8], alpha[4], beta[4], theta[4], gamma[4];

    //
    // Rows -
    //
    //  Treat this just like matrix-vector multiplication. The
    //  trick is to note that:
    //
    //    [M00 M01 M02 M03][v0]   [(v0 M00) + (v1 M01) + (v2 M02) + (v3 M03)]
    //    [M10 M11 M12 M13][v1] = [(v0 M10) + (v1 M11) + (v2 M12) + (v3 M13)]
    //    [M20 M21 M22 M23][v2]   [(v0 M20) + (v1 M21) + (v2 M22) + (v3 M23)]
    //    [M30 M31 M32 M33][v3]   [(v0 M30) + (v1 M31) + (v2 M32) + (v3 M33)]
    //
    // Then, we can fill a register with v_i and multiply by the i-th column
    // of M, accumulating across all i-s.
    //
    // The kids refer to the populating of a register with a single value
    // "broadcasting", and it can be done with a shuffle instruction. It
    // seems to be the slowest part of the whole ordeal.
    //
    // Our matrix columns are stored above in c0-c7. c0-3 make up M1, and
    // c4-7 are from M2.
    //

#    define DCT_INVERSE_8x8_SS2_ROW_LOOP(i)                                    \
        /*                                                              \
             * Broadcast the components of the row                          \
             */      \
                                                                               \
        x[0] = _mm_shuffle_ps (                                                \
            srcVec[2 * i], srcVec[2 * i], _MM_SHUFFLE (0, 0, 0, 0));           \
                                                                               \
        x[1] = _mm_shuffle_ps (                                                \
            srcVec[2 * i], srcVec[2 * i], _MM_SHUFFLE (1, 1, 1, 1));           \
                                                                               \
        x[2] = _mm_shuffle_ps (                                                \
            srcVec[2 * i], srcVec[2 * i], _MM_SHUFFLE (2, 2, 2, 2));           \
                                                                               \
        x[3] = _mm_shuffle_ps (                                                \
            srcVec[2 * i], srcVec[2 * i], _MM_SHUFFLE (3, 3, 3, 3));           \
                                                                               \
        x[4] = _mm_shuffle_ps (                                                \
            srcVec[2 * i + 1], srcVec[2 * i + 1], _MM_SHUFFLE (0, 0, 0, 0));   \
                                                                               \
        x[5] = _mm_shuffle_ps (                                                \
            srcVec[2 * i + 1], srcVec[2 * i + 1], _MM_SHUFFLE (1, 1, 1, 1));   \
                                                                               \
        x[6] = _mm_shuffle_ps (                                                \
            srcVec[2 * i + 1], srcVec[2 * i + 1], _MM_SHUFFLE (2, 2, 2, 2));   \
                                                                               \
        x[7] = _mm_shuffle_ps (                                                \
            srcVec[2 * i + 1], srcVec[2 * i + 1], _MM_SHUFFLE (3, 3, 3, 3));   \
        /*                                                              \
             * Multiply the components by each column of the matrix         \
             */      \
                                                                               \
        x[0] = _mm_mul_ps (x[0], c0);                                          \
        x[2] = _mm_mul_ps (x[2], c1);                                          \
        x[4] = _mm_mul_ps (x[4], c2);                                          \
        x[6] = _mm_mul_ps (x[6], c3);                                          \
                                                                               \
        x[1] = _mm_mul_ps (x[1], c4);                                          \
        x[3] = _mm_mul_ps (x[3], c5);                                          \
        x[5] = _mm_mul_ps (x[5], c6);                                          \
        x[7] = _mm_mul_ps (x[7], c7);                                          \
                                                                               \
        /*                                                              \
             * Add across                                                   \
             */      \
                                                                               \
        evenSum = _mm_setzero_ps ();                                           \
        evenSum = _mm_add_ps (evenSum, x[0]);                                  \
        evenSum = _mm_add_ps (evenSum, x[2]);                                  \
        evenSum = _mm_add_ps (evenSum, x[4]);                                  \
        evenSum = _mm_add_ps (evenSum, x[6]);                                  \
                                                                               \
        oddSum = _mm_setzero_ps ();                                            \
        oddSum = _mm_add_ps (oddSum, x[1]);                                    \
        oddSum = _mm_add_ps (oddSum, x[3]);                                    \
        oddSum = _mm_add_ps (oddSum, x[5]);                                    \
        oddSum = _mm_add_ps (oddSum, x[7]);                                    \
                                                                               \
        /*                                                              \
             * Final Sum:                                                   \
             *    out [0, 1, 2, 3] = evenSum + oddSum                       \
             *    out [7, 6, 5, 4] = evenSum - oddSum                       \
             */      \
                                                                               \
        srcVec[2 * i]     = _mm_add_ps (evenSum, oddSum);                      \
        srcVec[2 * i + 1] = _mm_sub_ps (evenSum, oddSum);                      \
        srcVec[2 * i + 1] = _mm_shuffle_ps (                                   \
            srcVec[2 * i + 1], srcVec[2 * i + 1], _MM_SHUFFLE (0, 1, 2, 3))

    switch (zeroedRows)
    {
        case 0:
        default:
            DCT_INVERSE_8x8_SS2_ROW_LOOP (0);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (1);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (2);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (3);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (4);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (5);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (6);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (7);
            break;

        case 1:
            DCT_INVERSE_8x8_SS2_ROW_LOOP (0);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (1);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (2);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (3);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (4);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (5);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (6);
            break;

        case 2:
            DCT_INVERSE_8x8_SS2_ROW_LOOP (0);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (1);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (2);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (3);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (4);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (5);
            break;

        case 3:
            DCT_INVERSE_8x8_SS2_ROW_LOOP (0);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (1);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (2);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (3);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (4);
            break;

        case 4:
            DCT_INVERSE_8x8_SS2_ROW_LOOP (0);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (1);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (2);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (3);
            break;

        case 5:
            DCT_INVERSE_8x8_SS2_ROW_LOOP (0);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (1);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (2);
            break;

        case 6:
            DCT_INVERSE_8x8_SS2_ROW_LOOP (0);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (1);
            break;

        case 7: DCT_INVERSE_8x8_SS2_ROW_LOOP (0); break;
    }

#    undef DCT_INVERSE_8x8_SS2_ROW_LOOP
    //
    // Columns -
    //
    // This is slightly more straightforward, if less readable. Here
    // we just operate on 4 columns at a time, in two batches.
    //
    // The slight mess is to try and cache sub-expressions, which
    // we ignore in the row-wise pass.
    //

    for (int col = 0; col < 2; ++col)
    {

        for (int i = 0; i < 8; ++i)
            in[i] = srcVec[2 * i + col];

        alpha[0] = _mm_mul_ps (c, in[2]);
        alpha[1] = _mm_mul_ps (f, in[2]);
        alpha[2] = _mm_mul_ps (c, in[6]);
        alpha[3] = _mm_mul_ps (f, in[6]);

        beta[0] = _mm_add_ps (
            _mm_add_ps (_mm_mul_ps (in[1], b), _mm_mul_ps (in[3], d)),
            _mm_add_ps (_mm_mul_ps (in[5], e), _mm_mul_ps (in[7], g)));

        beta[1] = _mm_sub_ps (
            _mm_sub_ps (_mm_mul_ps (in[1], d), _mm_mul_ps (in[3], g)),
            _mm_add_ps (_mm_mul_ps (in[5], b), _mm_mul_ps (in[7], e)));

        beta[2] = _mm_add_ps (
            _mm_sub_ps (_mm_mul_ps (in[1], e), _mm_mul_ps (in[3], b)),
            _mm_add_ps (_mm_mul_ps (in[5], g), _mm_mul_ps (in[7], d)));

        beta[3] = _mm_add_ps (
            _mm_sub_ps (_mm_mul_ps (in[1], g), _mm_mul_ps (in[3], e)),
            _mm_sub_ps (_mm_mul_ps (in[5], d), _mm_mul_ps (in[7], b)));

        theta[0] = _mm_mul_ps (a, _mm_add_ps (in[0], in[4]));
        theta[3] = _mm_mul_ps (a, _mm_sub_ps (in[0], in[4]));

        theta[1] = _mm_add_ps (alpha[0], alpha[3]);
        theta[2] = _mm_sub_ps (alpha[1], alpha[2]);

        gamma[0] = _mm_add_ps (theta[0], theta[1]);
        gamma[1] = _mm_add_ps (theta[3], theta[2]);
        gamma[2] = _mm_sub_ps (theta[3], theta[2]);
        gamma[3] = _mm_sub_ps (theta[0], theta[1]);

        srcVec[col]     = _mm_add_ps (gamma[0], beta[0]);
        srcVec[2 + col] = _mm_add_ps (gamma[1], beta[1]);
        srcVec[4 + col] = _mm_add_ps (gamma[2], beta[2]);
        srcVec[6 + col] = _mm_add_ps (gamma[3], beta[3]);

        srcVec[8 + col]  = _mm_sub_ps (gamma[3], beta[3]);
        srcVec[10 + col] = _mm_sub_ps (gamma[2], beta[2]);
        srcVec[12 + col] = _mm_sub_ps (gamma[1], beta[1]);
        srcVec[14 + col] = _mm_sub_ps (gamma[0], beta[0]);
    }

#else /* IMF_HAVE_SSE2 */

    dctInverse8x8_scalar<zeroedRows> (data);

#endif /* IMF_HAVE_SSE2 */
}